

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeResolveLabel(Vdbe *v,int x)

{
  Vdbe *v_00;
  uint in_ESI;
  long in_RDI;
  int j;
  Parse *p;
  undefined4 in_stack_fffffffffffffff0;
  
  v_00 = *(Vdbe **)(in_RDI + 0x18);
  if (*(int *)((long)&v_00->iCurrentTime + 4) + (int)v_00->iCurrentTime < 0) {
    resizeResolveLabel((Parse *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),v_00,in_ESI ^ 0xffffffff)
    ;
  }
  else {
    *(undefined4 *)(v_00->nFkConstraint + (long)(int)(in_ESI ^ 0xffffffff) * 4) =
         *(undefined4 *)(in_RDI + 0x90);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeResolveLabel(Vdbe *v, int x){
  Parse *p = v->pParse;
  int j = ADDR(x);
  assert( v->eVdbeState==VDBE_INIT_STATE );
  assert( j<-p->nLabel );
  assert( j>=0 );
#ifdef SQLITE_DEBUG
  if( p->db->flags & SQLITE_VdbeAddopTrace ){
    printf("RESOLVE LABEL %d to %d\n", x, v->nOp);
  }
#endif
  if( p->nLabelAlloc + p->nLabel < 0 ){
    resizeResolveLabel(p,v,j);
  }else{
    assert( p->aLabel[j]==(-1) ); /* Labels may only be resolved once */
    p->aLabel[j] = v->nOp;
  }
}